

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BeginDocked(ImGuiWindow *window,bool *p_open)

{
  byte bVar1;
  ImGuiTabBar *tab_bar;
  ImGuiContext *ctx;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID IVar4;
  uint uVar5;
  ImGuiContext *g_1;
  ImGuiDockNode *pIVar6;
  ImGuiTabItem *pIVar7;
  char cVar8;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 uVar9;
  ImGuiDockNode *node;
  short sVar10;
  ImGuiContext *g;
  
  ctx = GImGui;
  bVar3 = GetWindowAlwaysWantOwnTabBar(window);
  uVar9 = extraout_DL;
  if (bVar3) {
    IVar4 = window->DockId;
    if (IVar4 == 0) {
      IVar4 = DockContextGenNodeID(ctx);
      window->DockId = IVar4;
      uVar9 = extraout_DL_00;
    }
  }
  else {
    cVar8 = '\0';
    if ((((ctx->NextWindowData).Flags & 1) != 0) &&
       (uVar5 = (ctx->NextWindowData).PosCond, uVar9 = (undefined1)uVar5,
       (window->SetWindowPosAllowFlags & uVar5) != 0)) {
      cVar8 = (ctx->NextWindowData).PosUndock;
    }
    if (cVar8 != '\0' || ((uint)window->Flags >> 0x15 & 1) != 0) goto LAB_0015028f;
    IVar4 = window->DockId;
  }
  pIVar6 = window->DockNode;
  if (pIVar6 == (ImGuiDockNode *)0x0 && IVar4 != 0) {
    pIVar6 = DockContextFindNodeByID(ctx,IVar4);
    if (pIVar6 == (ImGuiDockNode *)0x0) {
      pIVar6 = DockContextAddNode(ctx,IVar4);
      uVar5 = *(uint *)&pIVar6->field_0xb0 & 0xfffffe00 | 0x92;
      *(short *)&pIVar6->field_0xb0 = (short)uVar5;
      pIVar6->LastFrameAlive = ctx->FrameCount;
    }
    else {
      uVar9 = extraout_DL_01;
      if (pIVar6->ChildNodes[0] != (ImGuiDockNode *)0x0) goto LAB_0015028f;
      uVar5 = (uint)*(ushort *)&pIVar6->field_0xb0;
    }
    node = pIVar6;
    if ((uVar5 >> 9 & 1) == 0) {
      while ((uVar5 >> 9 & 1) == 0) {
        *(ushort *)&node->field_0xb0 = (ushort)uVar5 | 0x200;
        node->field_0xb2 = node->field_0xb2 | 8;
        if (node->ParentNode != (ImGuiDockNode *)0x0) {
          node = node->ParentNode;
        }
        uVar5 = (uint)*(ushort *)&node->field_0xb0;
      }
      DockNodeTreeUpdatePosSize(node,node->Pos,node->Size,true);
    }
    DockNodeAddWindow(pIVar6,window,true);
    uVar9 = extraout_DL_02;
    if (pIVar6 == (ImGuiDockNode *)0x0) {
      return;
    }
  }
  if (pIVar6->LastFrameAlive < ctx->FrameCount) {
    pIVar6 = DockNodeGetRootNode((ImGuiDockNode *)(ulong)(uint)pIVar6->LastFrameAlive);
    uVar9 = extraout_DL_03;
    if (ctx->FrameCount <= pIVar6->LastFrameAlive) {
      window->field_0x43a = (window->field_0x43a & 0xfc) + 1;
      return;
    }
LAB_0015028f:
    DockContextProcessUndockWindow((ImGuiContext *)window,(ImGuiWindow *)0x1,(bool)uVar9);
    return;
  }
  if (pIVar6->HostWindow == (ImGuiWindow *)0x0) {
    window->field_0x43a =
         window->field_0x43a & 0xfc |
         pIVar6->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
    return;
  }
  pIVar6->State = ImGuiDockNodeState_HostWindowVisible;
  pIVar2 = GImGui;
  if (window->BeginOrderWithinContext < pIVar6->HostWindow->BeginOrderWithinContext)
  goto LAB_0015028f;
  uVar5 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar5 | 1;
  (pIVar2->NextWindowData).PosVal = pIVar6->Pos;
  (pIVar2->NextWindowData).PosPivotVal.x = 0.0;
  (pIVar2->NextWindowData).PosPivotVal.y = 0.0;
  (pIVar2->NextWindowData).PosCond = 1;
  (pIVar2->NextWindowData).PosUndock = true;
  (pIVar2->NextWindowData).Flags = uVar5 | 3;
  (pIVar2->NextWindowData).SizeVal = pIVar6->Size;
  (pIVar2->NextWindowData).SizeCond = 1;
  (ctx->NextWindowData).PosUndock = false;
  bVar1 = window->field_0x43a;
  window->field_0x43a = (bVar1 & 0xfc) + 1;
  if ((pIVar6->SharedFlags & 1) != 0) {
    return;
  }
  if (pIVar6->VisibleWindow == window) {
    window->field_0x43a = bVar1 | 3;
  }
  uVar5 = window->Flags | 0x1010003;
  if ((pIVar6->LocalFlags & 0x3000) == 0) {
    uVar5 = window->Flags & 0xfefefffcU | 0x1010002;
  }
  window->Flags = uVar5;
  if ((pIVar6->TabBar != (ImGuiTabBar *)0x0) && (pIVar6->TabBar->CurrFrameVisible != -1)) {
    tab_bar = window->DockNode->TabBar;
    sVar10 = -1;
    if ((tab_bar != (ImGuiTabBar *)0x0) &&
       (pIVar7 = TabBarFindTabByID(tab_bar,window->ID), pIVar7 != (ImGuiTabItem *)0x0)) {
      sVar10 = (short)(((long)pIVar7 - (long)(tab_bar->Tabs).Data) / 0x28);
    }
    window->DockOrder = sVar10;
  }
  if ((pIVar6->field_0xb1 & 0x40) == 0) {
    if ((p_open == (bool *)0x0) || (pIVar6->WantCloseTabID != window->ID)) goto LAB_001503e6;
  }
  else if (p_open == (bool *)0x0) goto LAB_001503e6;
  *p_open = false;
LAB_001503e6:
  IVar4 = ImGuiWindow::GetID(window->DockNode->HostWindow,window->Name,(char *)0x0);
  window->ChildId = IVar4;
  return;
}

Assistant:

void ImGui::BeginDocked(ImGuiWindow* window, bool* p_open)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    const bool auto_dock_node = GetWindowAlwaysWantOwnTabBar(window);
    if (auto_dock_node)
    {
        if (window->DockId == 0)
        {
            IM_ASSERT(window->DockNode == NULL);
            window->DockId = DockContextGenNodeID(ctx);
        }
    }
    else
    {
        // Calling SetNextWindowPos() undock windows by default (by setting PosUndock)
        bool want_undock = false;
        want_undock |= (window->Flags & ImGuiWindowFlags_NoDocking) != 0;
        want_undock |= (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) && (window->SetWindowPosAllowFlags & g.NextWindowData.PosCond) && g.NextWindowData.PosUndock;
        if (want_undock)
        {
            DockContextProcessUndockWindow(ctx, window);
            return;
        }
    }

    // Bind to our dock node
    ImGuiDockNode* node = window->DockNode;
    if (node != NULL)
        IM_ASSERT(window->DockId == node->ID);
    if (window->DockId != 0 && node == NULL)
    {
        node = DockContextBindNodeToWindow(ctx, window);
        if (node == NULL)
            return;
    }

#if 0
    // Undock if the ImGuiDockNodeFlags_NoDockingInCentralNode got set
    if (node->IsCentralNode && (node->Flags & ImGuiDockNodeFlags_NoDockingInCentralNode))
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }
#endif

    // Undock if our dockspace node disappeared
    // Note how we are testing for LastFrameAlive and NOT LastFrameActive. A DockSpace node can be maintained alive while being inactive with ImGuiDockNodeFlags_KeepAliveOnly.
    if (node->LastFrameAlive < g.FrameCount)
    {
        // If the window has been orphaned, transition the docknode to an implicit node processed in DockContextUpdateDocking()
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->LastFrameAlive < g.FrameCount)
        {
            DockContextProcessUndockWindow(ctx, window);
        }
        else
        {
            window->DockIsActive = true;
            window->DockTabIsVisible = false;
        }
        return;
    }

    // Fast path return. It is common for windows to hold on a persistent DockId but be the only visible window,
    // and never create neither a host window neither a tab bar.
    // FIXME-DOCK: replace ->HostWindow NULL compare with something more explicit (~was initially intended as a first frame test)
    if (node->HostWindow == NULL)
    {
        window->DockIsActive = (node->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing);
        window->DockTabIsVisible = false;
        return;
    }

    // We can have zero-sized nodes (e.g. children of a small-size dockspace)
    IM_ASSERT(node->HostWindow);
    IM_ASSERT(node->IsLeafNode());
    IM_ASSERT(node->Size.x >= 0.0f && node->Size.y >= 0.0f);
    node->State = ImGuiDockNodeState_HostWindowVisible;

    // Undock if we are submitted earlier than the host window
    if (window->BeginOrderWithinContext < node->HostWindow->BeginOrderWithinContext)
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }

    // Position/Size window
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false; // Cancel implicit undocking of SetNextWindowPos()
    window->DockIsActive = true;
    window->DockTabIsVisible = false;
    if (node->SharedFlags & ImGuiDockNodeFlags_KeepAliveOnly)
        return;

    // When the window is selected we mark it as visible.
    if (node->VisibleWindow == window)
        window->DockTabIsVisible = true;

    // Update window flag
    IM_ASSERT((window->Flags & ImGuiWindowFlags_ChildWindow) == 0);
    window->Flags |= ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysUseWindowPadding | ImGuiWindowFlags_NoResize;
    if (node->IsHiddenTabBar() || node->IsNoTabBar())
        window->Flags |= ImGuiWindowFlags_NoTitleBar;
    else
        window->Flags &= ~ImGuiWindowFlags_NoTitleBar;      // Clear the NoTitleBar flag in case the user set it: confusingly enough we need a title bar height so we are correctly offset, but it won't be displayed!

    // Save new dock order only if the tab bar has been visible once.
    // This allows multiple windows to be created in the same frame and have their respective dock orders preserved.
    if (node->TabBar && node->TabBar->CurrFrameVisible != -1)
        window->DockOrder = (short)DockNodeGetTabOrder(window);

    if ((node->WantCloseAll || node->WantCloseTabID == window->ID) && p_open != NULL)
        *p_open = false;

    // Update ChildId to allow returning from Child to Parent with Escape
    ImGuiWindow* parent_window = window->DockNode->HostWindow;
    window->ChildId = parent_window->GetID(window->Name);
}